

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  bool bVar1;
  ulong uVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  unsigned_long uVar7;
  ulong n;
  char *__last;
  ulong uVar8;
  char *__last_00;
  char buffer [17];
  char local_48 [24];
  
  uVar2 = 2;
  uVar7 = value;
  __last = local_48;
  __last_00 = local_48;
  do {
    pcVar5 = __last_00;
    pcVar6 = __last;
    __last = pcVar6 + 1;
    __last_00 = pcVar5 + 1;
    uVar2 = uVar2 + 1;
    bVar1 = 0xf < uVar7;
    uVar7 = uVar7 >> 4;
  } while (bVar1);
  if (specs == (basic_format_specs<char> *)0x0) {
    sVar4 = (out.container)->size_;
    uVar2 = sVar4 + 1;
    if ((out.container)->capacity_ < uVar2) {
      (**(out.container)->_vptr_buffer)(out.container);
      sVar4 = (out.container)->size_;
      uVar2 = sVar4 + 1;
    }
    (out.container)->size_ = uVar2;
    (out.container)->ptr_[sVar4] = '0';
    sVar4 = (out.container)->size_;
    uVar2 = sVar4 + 1;
    if ((out.container)->capacity_ < uVar2) {
      (**(out.container)->_vptr_buffer)(out.container);
      sVar4 = (out.container)->size_;
      uVar2 = sVar4 + 1;
    }
    (out.container)->size_ = uVar2;
    (out.container)->ptr_[sVar4] = 'x';
    do {
      *pcVar6 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar6 = pcVar6 + -1;
      bVar1 = 0xf < value;
      value = value >> 4;
    } while (bVar1);
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (local_48,__last,out);
  }
  else {
    uVar8 = 0;
    if (uVar2 <= (uint)specs->width) {
      uVar8 = (uint)specs->width - uVar2;
    }
    n = uVar8 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>(out,n,&specs->fill);
    sVar4 = (bVar3.container)->size_;
    uVar2 = sVar4 + 1;
    if ((bVar3.container)->capacity_ < uVar2) {
      (**(bVar3.container)->_vptr_buffer)(bVar3.container);
      sVar4 = (bVar3.container)->size_;
      uVar2 = sVar4 + 1;
    }
    (bVar3.container)->size_ = uVar2;
    (bVar3.container)->ptr_[sVar4] = '0';
    sVar4 = (bVar3.container)->size_;
    uVar2 = sVar4 + 1;
    if ((bVar3.container)->capacity_ < uVar2) {
      (**(bVar3.container)->_vptr_buffer)(bVar3.container);
      sVar4 = (bVar3.container)->size_;
      uVar2 = sVar4 + 1;
    }
    (bVar3.container)->size_ = uVar2;
    (bVar3.container)->ptr_[sVar4] = 'x';
    do {
      *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar5 = pcVar5 + -1;
      bVar1 = 0xf < value;
      value = value >> 4;
    } while (bVar1);
    bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (local_48,__last_00,bVar3);
    bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (bVar3,uVar8 - n,&specs->fill);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}